

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O0

void __thiscall
coinscachepair_tests::linked_list_add_flags::test_method(linked_list_add_flags *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffeac8;
  CoinsCachePair *in_stack_ffffffffffffead0;
  char *in_stack_ffffffffffffead8;
  CCoinsCacheEntry *in_stack_ffffffffffffeae0;
  undefined7 in_stack_ffffffffffffeaf0;
  undefined1 in_stack_ffffffffffffeaf7;
  lazy_ostream *in_stack_ffffffffffffeaf8;
  const_string *in_stack_ffffffffffffeb00;
  const_string *file;
  undefined7 in_stack_ffffffffffffeb08;
  undefined1 in_stack_ffffffffffffeb0f;
  linked_list_add_flags *this_local;
  CoinsCachePair *local_10d8;
  CoinsCachePair *local_10d0;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [64];
  CoinsCachePair *local_1078;
  CoinsCachePair *local_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [64];
  CoinsCachePair *local_1018;
  CoinsCachePair *local_1010;
  undefined1 local_1008 [8];
  uchar local_1000 [72];
  CoinsCachePair *local_fb8;
  CoinsCachePair *local_fb0;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [64];
  undefined1 local_f58 [96];
  CoinsCachePair *local_ef8;
  undefined1 local_ef0 [16];
  undefined1 local_ee0 [64];
  CoinsCachePair *local_ea0;
  CoinsCachePair *local_e98;
  undefined1 local_e90 [16];
  undefined1 local_e80 [64];
  CoinsCachePair *local_e40;
  CoinsCachePair *local_e38;
  undefined1 local_e30 [16];
  undefined1 local_e20 [64];
  CoinsCachePair *local_de0;
  CoinsCachePair *local_dd8;
  undefined1 local_dd0 [16];
  undefined1 local_dc0 [64];
  CoinsCachePair *local_d80;
  CoinsCachePair *local_d78;
  undefined1 local_d70 [16];
  undefined1 local_d60 [64];
  CoinsCachePair *local_d20;
  CoinsCachePair *local_d18;
  undefined1 local_d10 [16];
  undefined1 local_d00 [64];
  CoinsCachePair *local_cc0;
  CoinsCachePair *local_cb8;
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [64];
  CoinsCachePair *local_c60;
  CoinsCachePair *local_c58;
  undefined1 local_c50 [16];
  undefined1 local_c40 [64];
  undefined1 local_c00 [96];
  CoinsCachePair *local_ba0;
  undefined1 local_b98 [16];
  undefined1 local_b88 [64];
  CoinsCachePair *local_b48;
  CoinsCachePair *local_b40;
  undefined1 local_b38 [16];
  undefined1 local_b28 [64];
  CoinsCachePair *local_ae8;
  CoinsCachePair *local_ae0;
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [64];
  CoinsCachePair *local_a88;
  CoinsCachePair *local_a80;
  undefined1 local_a78 [16];
  undefined1 local_a68 [64];
  undefined1 local_a28 [96];
  CoinsCachePair *local_9c8;
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [64];
  CoinsCachePair *local_970;
  CoinsCachePair *local_968;
  undefined1 local_960 [16];
  undefined1 local_950 [64];
  CoinsCachePair *local_910;
  CoinsCachePair *local_908;
  undefined1 local_900 [16];
  undefined1 local_8f0 [64];
  CoinsCachePair *local_8b0;
  CoinsCachePair *local_8a8;
  undefined1 local_8a0 [16];
  undefined1 local_890 [64];
  undefined1 local_850 [96];
  CoinsCachePair *local_7f0;
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [64];
  CoinsCachePair *local_798;
  CoinsCachePair *local_790;
  undefined1 local_788 [16];
  undefined1 local_778 [64];
  CoinsCachePair *local_738;
  CoinsCachePair *local_730;
  undefined1 local_728 [16];
  undefined1 local_718 [64];
  CoinsCachePair *local_6d8;
  CoinsCachePair *local_6d0;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [64];
  undefined1 local_678 [96];
  CoinsCachePair *local_618;
  undefined1 local_610 [16];
  undefined1 local_600 [64];
  CoinsCachePair *local_5c0;
  CoinsCachePair *local_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [64];
  CoinsCachePair *local_560;
  CoinsCachePair *local_558;
  undefined1 local_550 [16];
  undefined1 local_540 [64];
  CoinsCachePair *local_500;
  CoinsCachePair *local_4f8;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [64];
  undefined1 local_4a0 [96];
  CoinsCachePair *local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [64];
  CoinsCachePair *local_3e8;
  CoinsCachePair *local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [64];
  CoinsCachePair *local_388;
  CoinsCachePair *local_380;
  undefined1 local_378 [16];
  undefined1 local_368 [64];
  CoinsCachePair *local_328;
  CoinsCachePair *local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [64];
  undefined1 local_2c8 [96];
  CoinsCachePair *local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [64];
  CoinsCachePair *local_210;
  CoinsCachePair *local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [88];
  CoinsCachePair n2;
  CoinsCachePair n1;
  CoinsCachePair sentinel;
  
  local_1000[0] = '\0';
  local_1000[1] = '\0';
  local_1000[2] = '\0';
  local_1000[3] = '\0';
  local_1000[4] = '\0';
  local_1000[5] = '\0';
  local_1000[6] = '\0';
  local_1000[7] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffeac8);
  CCoinsCacheEntry::SelfRef
            ((CCoinsCacheEntry *)in_stack_ffffffffffffead0,
             (CoinsCachePair *)in_stack_ffffffffffffeac8);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffeac8);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffeac8);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_1b0[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_1b0[0] = '\0';
    local_1b0[1] = '\0';
    local_1b0[2] = '\0';
    local_1b0[3] = '\0';
    in_stack_ffffffffffffead8 = "0";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_1b0;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_1b0 + 0x18,local_1b0 + 8,0x97,1,2,local_1b0 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_208 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_210 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_210;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_1f0,local_200,0x98,1,2,&local_208);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_268 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_2c8._88_8_ = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_2c8 + 0x58);
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_250,local_260,0x99,1,2,&local_268);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_2c8[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_2c8[0] = '\x01';
    local_2c8[1] = '\0';
    local_2c8[2] = '\0';
    local_2c8[3] = '\0';
    in_stack_ffffffffffffead8 = "CCoinsCacheEntry::DIRTY";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_2c8;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
              (local_2c8 + 0x18,local_2c8 + 8,0x9d,1,2,local_2c8 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_320 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_328 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_328;
    in_stack_ffffffffffffeac8 = "n1.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_308,local_318,0x9e,1,2,&local_320);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_380 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_388 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_388;
    in_stack_ffffffffffffeac8 = "n1.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_368,local_378,0x9f,1,2,&local_380);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_3e0 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_3e8 = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_3e8;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_3c8,local_3d8,0xa0,1,2,&local_3e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_440 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_4a0._88_8_ = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_4a0 + 0x58);
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_428,local_438,0xa1,1,2,&local_440);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_4a0[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_4a0[0] = '\x02';
    local_4a0[1] = '\0';
    local_4a0[2] = '\0';
    local_4a0[3] = '\0';
    in_stack_ffffffffffffead8 = "CCoinsCacheEntry::FRESH";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_4a0;
    in_stack_ffffffffffffeac8 = "n2.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
              (local_4a0 + 0x18,local_4a0 + 8,0xa5,1,2,local_4a0 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_4f8 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_500 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_500;
    in_stack_ffffffffffffeac8 = "n2.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_4e0,local_4f0,0xa6,1,2,&local_4f8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_558 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_560 = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_560;
    in_stack_ffffffffffffeac8 = "n2.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_540,local_550,0xa7,1,2,&local_558);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_5b8 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_5c0 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_5c0;
    in_stack_ffffffffffffeac8 = "n1.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_5a0,local_5b0,0xa8,1,2,&local_5b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_618 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_678._88_8_ = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_678 + 0x58);
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_600,local_610,0xa9,1,2,&local_618);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_678[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_678[0] = '\x01';
    local_678[1] = '\0';
    local_678[2] = '\0';
    local_678[3] = '\0';
    in_stack_ffffffffffffead8 = "CCoinsCacheEntry::DIRTY";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_678;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
              (local_678 + 0x18,local_678 + 8,0xad,1,2,local_678 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_6d0 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_6d8 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_6d8;
    in_stack_ffffffffffffeac8 = "n1.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_6b8,local_6c8,0xae,1,2,&local_6d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_730 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_738 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_738;
    in_stack_ffffffffffffeac8 = "n1.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_718,local_728,0xaf,1,2,&local_730);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_790 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_798 = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_798;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_778,local_788,0xb0,1,2,&local_790);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_7f0 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_850._88_8_ = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_850 + 0x58);
    in_stack_ffffffffffffeac8 = "n2.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_7d8,local_7e8,0xb1,1,2,&local_7f0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_850[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_850[0] = '\x03';
    local_850[1] = '\0';
    local_850[2] = '\0';
    local_850[3] = '\0';
    in_stack_ffffffffffffead8 = "CCoinsCacheEntry::DIRTY | CCoinsCacheEntry::FRESH";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_850;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_850 + 0x18,local_850 + 8,0xb5,1,2,local_850 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_8a8 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_8b0 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_8b0;
    in_stack_ffffffffffffeac8 = "n1.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_890,local_8a0,0xb6,1,2,&local_8a8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_908 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_910 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_910;
    in_stack_ffffffffffffeac8 = "n1.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_8f0,local_900,0xb7,1,2,&local_908);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_968 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_970 = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_970;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_950,local_960,0xb8,1,2,&local_968);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_9c8 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_a28._88_8_ = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_a28 + 0x58);
    in_stack_ffffffffffffeac8 = "n2.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_9b0,local_9c0,0xb9,1,2,&local_9c8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::ClearFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_a28[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_a28[0] = '\0';
    local_a28[1] = '\0';
    local_a28[2] = '\0';
    local_a28[3] = '\0';
    in_stack_ffffffffffffead8 = "0";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_a28;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_a28 + 0x18,local_a28 + 8,0xbd,1,2,local_a28 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_a80 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_a88 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_a88;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_a68,local_a78,0xbe,1,2,&local_a80);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_ae0 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_ae8 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_ae8;
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_ac8,local_ad8,0xbf,1,2,&local_ae0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_b40 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_b48 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_b48;
    in_stack_ffffffffffffeac8 = "n2.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_b28,local_b38,0xc0,1,2,&local_b40);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_ba0 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_c00._88_8_ = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_c00 + 0x58);
    in_stack_ffffffffffffeac8 = "n2.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_b88,local_b98,0xc1,1,2,&local_ba0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::ClearFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_c00[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_c00[0] = '\0';
    local_c00[1] = '\0';
    local_c00[2] = '\0';
    local_c00[3] = '\0';
    in_stack_ffffffffffffead8 = "0";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_c00;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_c00 + 0x18,local_c00 + 8,0xc5,1,2,local_c00 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_c58 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_c60 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_c60;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_c40,local_c50,0xc6,1,2,&local_c58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_cb8 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_cc0 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_cc0;
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_ca0,local_cb0,199,1,2,&local_cb8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_d18 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_d20 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_d20;
    in_stack_ffffffffffffeac8 = "n2.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_d00,local_d10,200,1,2,&local_d18);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_d78 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_d80 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_d80;
    in_stack_ffffffffffffeac8 = "n2.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_d60,local_d70,0xc9,1,2,&local_d78);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_dd8 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_de0 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_de0;
    in_stack_ffffffffffffeac8 = "sentinel.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_dc0,local_dd0,0xcd,1,2,&local_dd8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_e38 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_e40 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_e40;
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_e20,local_e30,0xce,1,2,&local_e38);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_e98 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_ea0 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_ea0;
    in_stack_ffffffffffffeac8 = "n2.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_e80,local_e90,0xcf,1,2,&local_e98);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_ef8 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_f58._88_8_ = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)(local_f58 + 0x58);
    in_stack_ffffffffffffeac8 = "n2.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_ee0,local_ef0,0xd0,1,2,&local_ef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CCoinsCacheEntry::AddFlags
            (in_stack_ffffffffffffeae0,(uint8_t)((ulong)in_stack_ffffffffffffead8 >> 0x38),
             in_stack_ffffffffffffead0,(CoinsCachePair *)in_stack_ffffffffffffeac8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_f58[7] = CCoinsCacheEntry::GetFlags((CCoinsCacheEntry *)in_stack_ffffffffffffeac8);
    local_f58[0] = '\x01';
    local_f58[1] = '\0';
    local_f58[2] = '\0';
    local_f58[3] = '\0';
    in_stack_ffffffffffffead8 = "CCoinsCacheEntry::DIRTY";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)local_f58;
    in_stack_ffffffffffffeac8 = "n1.second.GetFlags()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
              (local_f58 + 0x18,local_f58 + 8,0xd4,1,2,local_f58 + 7);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_fb0 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_fb8 = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_fb8;
    in_stack_ffffffffffffeac8 = "n2.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_f98,local_fa8,0xd5,1,2,&local_fb0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_1010 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_1018 = &n2;
    in_stack_ffffffffffffead8 = "&n2";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_1018;
    in_stack_ffffffffffffeac8 = "n1.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_1000 + 8,local_1008,0xd6,1,2,&local_1010);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),
               in_stack_ffffffffffffeb00,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_1070 = CCoinsCacheEntry::Next((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_1078 = &sentinel;
    in_stack_ffffffffffffead8 = "&sentinel";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_1078;
    in_stack_ffffffffffffeac8 = "n1.second.Next()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_1058,local_1068,0xd7,1,2,&local_1070);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    in_stack_ffffffffffffeb0f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffeb0f);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeac8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffeb0f,in_stack_ffffffffffffeb08),file
               ,(size_t)in_stack_ffffffffffffeaf8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeaf7,in_stack_ffffffffffffeaf0));
    in_stack_ffffffffffffeaf8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffead0,(char (*) [1])in_stack_ffffffffffffeac8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffead8,
               (pointer)in_stack_ffffffffffffead0,(unsigned_long)in_stack_ffffffffffffeac8);
    local_10d0 = CCoinsCacheEntry::Prev((CCoinsCacheEntry *)in_stack_ffffffffffffead8);
    local_10d8 = &n1;
    in_stack_ffffffffffffead8 = "&n1";
    in_stack_ffffffffffffead0 = (CoinsCachePair *)&local_10d8;
    in_stack_ffffffffffffeac8 = "sentinel.second.Prev()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (local_10b8,local_10c8,0xd8,1,2,&local_10d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeac8);
    in_stack_ffffffffffffeaf7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffeaf7);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::~pair
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffeac8);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::~pair
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffeac8);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::~pair
            ((pair<const_COutPoint,_CCoinsCacheEntry> *)in_stack_ffffffffffffeac8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_add_flags)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    CoinsCachePair n1;
    CoinsCachePair n2;

    // Check that adding 0 flag has no effect
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);

    // Check that adding DIRTY flag inserts it into linked list and sets flags
    n1.second.AddFlags(CCoinsCacheEntry::DIRTY, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n1);

    // Check that adding FRESH flag on new node inserts it after n1
    n2.second.AddFlags(CCoinsCacheEntry::FRESH, n2, sentinel);
    BOOST_CHECK_EQUAL(n2.second.GetFlags(), CCoinsCacheEntry::FRESH);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);

    // Check that adding 0 flag has no effect, and doesn't change position
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);

    // Check that we can add extra flags, but they don't change our position
    n1.second.AddFlags(CCoinsCacheEntry::FRESH, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY | CCoinsCacheEntry::FRESH);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);

    // Check that we can clear flags then re-add them
    n1.second.ClearFlags();
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // Check that calling `ClearFlags` with 0 flags has no effect
    n1.second.ClearFlags();
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // Adding 0 still has no effect
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // But adding DIRTY re-inserts it after n2
    n1.second.AddFlags(CCoinsCacheEntry::DIRTY, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n2.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n1);
}